

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O0

RegexMatcher * __thiscall icu_63::RegexMatcher::reset(RegexMatcher *this,UnicodeString *input)

{
  UBool UVar1;
  UText *pUVar2;
  int64_t iVar3;
  undefined4 local_24;
  UnicodeString *pUStack_20;
  UErrorCode status;
  UnicodeString *input_local;
  RegexMatcher *this_local;
  
  pUStack_20 = input;
  input_local = (UnicodeString *)this;
  pUVar2 = utext_openConstUnicodeString_63(this->fInputText,input,&this->fDeferredStatus);
  this->fInputText = pUVar2;
  if (this->fPattern->fNeedsAltInput != '\0') {
    pUVar2 = utext_clone_63(this->fAltInputText,this->fInputText,'\0','\x01',&this->fDeferredStatus)
    ;
    this->fAltInputText = pUVar2;
  }
  UVar1 = ::U_FAILURE(this->fDeferredStatus);
  if (UVar1 == '\0') {
    iVar3 = utext_nativeLength_63(this->fInputText);
    this->fInputLength = iVar3;
    reset(this);
    if (this->fInput != (UnicodeString *)0x0) {
      (*(this->fInput->super_Replaceable).super_UObject._vptr_UObject[1])();
    }
    this->fInput = (UnicodeString *)0x0;
    this->fInputUniStrMaybeMutable = '\x01';
    if (this->fWordBreakItr != (RuleBasedBreakIterator *)0x0) {
      local_24 = 0;
      (*(this->fWordBreakItr->super_BreakIterator).super_UObject._vptr_UObject[8])
                (this->fWordBreakItr,this->fInputText,&local_24);
    }
  }
  return this;
}

Assistant:

RegexMatcher &RegexMatcher::reset(const UnicodeString &input) {
    fInputText = utext_openConstUnicodeString(fInputText, &input, &fDeferredStatus);
    if (fPattern->fNeedsAltInput) {
        fAltInputText = utext_clone(fAltInputText, fInputText, FALSE, TRUE, &fDeferredStatus);
    }
    if (U_FAILURE(fDeferredStatus)) {
        return *this;
    }
    fInputLength = utext_nativeLength(fInputText);

    reset();
    delete fInput;
    fInput = NULL;

    //  Do the following for any UnicodeString.
    //  This is for compatibility for those clients who modify the input string "live" during regex operations.
    fInputUniStrMaybeMutable = TRUE;

    if (fWordBreakItr != NULL) {
#if UCONFIG_NO_BREAK_ITERATION==0
        UErrorCode status = U_ZERO_ERROR;
        fWordBreakItr->setText(fInputText, status);
#endif
    }
    return *this;
}